

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void duckdb::RenderPhaseTimings
               (ostream *ss,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               *head,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *timings,idx_t width)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  duckdb *pdVar8;
  long *plVar9;
  duckdb *this;
  ulong uVar10;
  undefined8 uVar11;
  _Rb_tree_header *p_Var12;
  duckdb *local_160;
  long local_158;
  ulong local_150;
  undefined8 uStack_148;
  string local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  ostream *local_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  idx_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_100 = ss;
  local_b8 = width;
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,anon_var_dwarf_10d8613,0x97);
  pcVar3 = (head->first)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (head->first)._M_string_length);
  RenderTitleCase(&local_b0,&local_50);
  this = (duckdb *)0x13ac2ce;
  puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b0);
  pdVar8 = (duckdb *)(puVar5 + 2);
  if ((duckdb *)*puVar5 == pdVar8) {
    local_150 = *(ulong *)pdVar8;
    uStack_148 = puVar5[3];
    local_160 = (duckdb *)&local_150;
  }
  else {
    local_150 = *(ulong *)pdVar8;
    local_160 = (duckdb *)*puVar5;
  }
  local_158 = puVar5[1];
  *puVar5 = pdVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  RenderTiming_abi_cxx11_(&local_f8,this,head->second);
  uVar10 = 0xf;
  if (local_160 != (duckdb *)&local_150) {
    uVar10 = local_150;
  }
  if (uVar10 < local_f8._M_string_length + local_158) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar11 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_158 <= (ulong)uVar11) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_160);
      goto LAB_004e7be0;
    }
  }
  puVar5 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
LAB_004e7be0:
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_140.field_2._M_allocated_capacity = *psVar1;
    local_140.field_2._8_8_ = puVar5[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar1;
    local_140._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_140._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  QueryProfiler::DrawPadded(&local_90,&local_140,local_b8 - 2);
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x13765be);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_c8 = *plVar9;
    lStack_c0 = plVar6[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar9;
    local_d8 = (long *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_d8);
  local_120 = &local_110;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_110 = *plVar9;
    lStack_108 = plVar6[3];
  }
  else {
    local_110 = *plVar9;
    local_120 = (long *)*plVar6;
  }
  local_118 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_100,(char *)local_120,local_118);
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  paVar2 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_160 != (duckdb *)&local_150) {
    operator_delete(local_160);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_100,anon_var_dwarf_10d864f,0x97);
  p_Var7 = (timings->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(timings->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var12) {
    local_b8 = local_b8 - 4;
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      RenderTitleCase(&local_b0,&local_70);
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_b0);
      pdVar8 = (duckdb *)(puVar5 + 2);
      if ((duckdb *)*puVar5 == pdVar8) {
        local_150 = *(ulong *)pdVar8;
        uStack_148 = puVar5[3];
        local_160 = (duckdb *)&local_150;
      }
      else {
        local_150 = *(ulong *)pdVar8;
        local_160 = (duckdb *)*puVar5;
      }
      local_158 = puVar5[1];
      *puVar5 = pdVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      RenderTiming_abi_cxx11_(&local_f8,(duckdb *)&local_150,*(double *)(p_Var7 + 2));
      uVar10 = 0xf;
      if (local_160 != (duckdb *)&local_150) {
        uVar10 = local_150;
      }
      if (uVar10 < local_f8._M_string_length + local_158) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_158) goto LAB_004e7ee7;
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_160);
      }
      else {
LAB_004e7ee7:
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
      }
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_140.field_2._M_allocated_capacity = *psVar1;
        local_140.field_2._8_8_ = puVar5[3];
        local_140._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar1;
        local_140._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_140._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      QueryProfiler::DrawPadded(&local_90,&local_140,local_b8);
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x13765bb);
      local_d8 = &local_c8;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = puVar5[3];
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*puVar5;
      }
      local_d0 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_d8);
      local_120 = &local_110;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_110 = *plVar6;
        lStack_108 = puVar5[3];
      }
      else {
        local_110 = *plVar6;
        local_120 = (long *)*puVar5;
      }
      local_118 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_100,(char *)local_120,local_118);
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_160 != (duckdb *)&local_150) {
        operator_delete(local_160);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var12);
  }
  poVar4 = local_100;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_100,anon_var_dwarf_10d8673,0x97);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,anon_var_dwarf_10d867f,0x97);
  return;
}

Assistant:

void RenderPhaseTimings(std::ostream &ss, const pair<string, double> &head, map<string, double> &timings, idx_t width) {
	ss << "┌────────────────────────────────────────────────┐\n";
	ss << "│" + QueryProfiler::DrawPadded(RenderTitleCase(head.first) + ": " + RenderTiming(head.second), width - 2) +
	          "│\n";
	ss << "│┌──────────────────────────────────────────────┐│\n";

	for (const auto &entry : timings) {
		ss << "││" +
		          QueryProfiler::DrawPadded(RenderTitleCase(entry.first) + ": " + RenderTiming(entry.second),
		                                    width - 4) +
		          "││\n";
	}
	ss << "│└──────────────────────────────────────────────┘│\n";
	ss << "└────────────────────────────────────────────────┘\n";
}